

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signals.cpp
# Opt level: O1

void reset_sigchld(void)

{
  __sighandler_t p_Var1;
  ContextManager *pCVar2;
  string local_30;
  
  p_Var1 = signal(0x11,(__sighandler_t)0x0);
  if (p_Var1 == (__sighandler_t)0xffffffffffffffff) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_30,"Failed to set SIGCHLD sigaction to SIG_DFL: %m");
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void reset_sigchld() {
    if (signal(SIGCHLD, SIG_DFL) == SIG_ERR) {
        die(format("Failed to set SIGCHLD sigaction to SIG_DFL: %m"));
    }
}